

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O0

EbmlElement *
libebml::EbmlElement::FindNextID
          (IOCallback *DataStream,EbmlCallbacks *ClassInfos,uint64 MaxDataSize)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EbmlDummy *this;
  ulong uVar3;
  EbmlDummy *local_b0;
  undefined1 local_88 [8];
  EbmlId PossibleID;
  EbmlElement *Result;
  uint32 _SizeLength;
  uint32 ReadSize;
  uint64 aSizePosition;
  uint64 aElementPosition;
  binary BitMask;
  uint64 uStack_50;
  bool bElementFound;
  uint64 SizeFound;
  uint64 SizeUnknown;
  binary local_38 [4];
  uint32 PossibleSizeLength;
  binary PossibleSize [8];
  int PossibleID_Length;
  binary PossibleId [4];
  uint64 MaxDataSize_local;
  EbmlCallbacks *ClassInfos_local;
  IOCallback *DataStream_local;
  
  PossibleSize[0] = '\0';
  PossibleSize[1] = '\0';
  PossibleSize[2] = '\0';
  PossibleSize[3] = '\0';
  SizeUnknown._4_4_ = 0;
  SizeFound = 0;
  uStack_50 = 0;
  aElementPosition._7_1_ = 0;
  aSizePosition = 0;
  __SizeLength = 0;
  do {
    if (((aElementPosition._7_1_ ^ 0xff) & 1) == 0) {
      PossibleID.Length = 0;
      EbmlId::EbmlId((EbmlId *)local_88,PossibleSize + 4,PossibleSize._0_4_);
      bVar1 = EbmlId::operator==((EbmlId *)local_88,ClassInfos->GlobalId);
      if (bVar1) {
        PossibleID.Length = (size_t)(*ClassInfos->Create)();
      }
      else {
        this = (EbmlDummy *)operator_new(0x50,(nothrow_t *)&std::nothrow);
        local_b0 = (EbmlDummy *)0x0;
        if (this != (EbmlDummy *)0x0) {
          EbmlDummy::EbmlDummy(this,(EbmlId *)local_88);
          local_b0 = this;
        }
        PossibleID.Length = (size_t)local_b0;
        if (local_b0 == (EbmlDummy *)0x0) {
          return (EbmlElement *)0x0;
        }
      }
      SetSizeLength((EbmlElement *)PossibleID.Length,SizeUnknown._4_4_);
      *(uint64 *)(PossibleID.Length + 8) = uStack_50;
      uVar3 = (**(code **)(*(long *)PossibleID.Length + 0x38))();
      if (((uVar3 & 1) == 0) ||
         ((uStack_50 != SizeFound && (MaxDataSize < *(ulong *)(PossibleID.Length + 8))))) {
        if (PossibleID.Length != 0) {
          (**(code **)(*(long *)PossibleID.Length + 8))();
        }
        DataStream_local = (IOCallback *)0x0;
      }
      else {
        if (uStack_50 == SizeFound) {
          uVar3 = (**(code **)(*(long *)PossibleID.Length + 0x30))(PossibleID.Length,1);
          if ((uVar3 & 1) == 0) {
            if (PossibleID.Length != 0) {
              (**(code **)(*(long *)PossibleID.Length + 8))();
            }
            return (EbmlElement *)0x0;
          }
        }
        else {
          (**(code **)(*(long *)PossibleID.Length + 0x30))(PossibleID.Length,0);
        }
        *(uint64 *)(PossibleID.Length + 0x20) = aSizePosition;
        *(undefined8 *)(PossibleID.Length + 0x28) = __SizeLength;
        DataStream_local = (IOCallback *)PossibleID.Length;
      }
      return (EbmlElement *)DataStream_local;
    }
    iVar2 = (*DataStream->_vptr_IOCallback[5])();
    aSizePosition = CONCAT44(extraout_var,iVar2);
    Result._4_4_ = 0;
    aElementPosition._6_1_ = 0x80;
    while( true ) {
      iVar2 = (*DataStream->_vptr_IOCallback[2])
                        (DataStream,PossibleSize + (long)(int)PossibleSize._0_4_ + 4,1);
      Result._4_4_ = iVar2 + Result._4_4_;
      if (Result._4_4_ == PossibleSize._0_4_) {
        return (EbmlElement *)0x0;
      }
      PossibleSize._0_4_ = PossibleSize._0_4_ + 1;
      if (4 < (int)PossibleSize._0_4_) {
        return (EbmlElement *)0x0;
      }
      if ((PossibleSize[4] & aElementPosition._6_1_) != 0) break;
      aElementPosition._6_1_ = (byte)((int)(uint)aElementPosition._6_1_ >> 1);
    }
    aElementPosition._7_1_ = 1;
    iVar2 = (*DataStream->_vptr_IOCallback[5])();
    __SizeLength = CONCAT44(extraout_var_00,iVar2);
    do {
      if (7 < SizeUnknown._4_4_) {
        return (EbmlElement *)0x0;
      }
      uVar3 = (ulong)SizeUnknown._4_4_;
      SizeUnknown._4_4_ = SizeUnknown._4_4_ + 1;
      iVar2 = (*DataStream->_vptr_IOCallback[2])(DataStream,local_38 + uVar3,1);
      Result._4_4_ = iVar2 + Result._4_4_;
      Result._0_4_ = SizeUnknown._4_4_;
      uStack_50 = ReadCodedSizeValue(local_38,(uint32 *)&Result,&SizeFound);
    } while ((uint)Result == 0);
  } while( true );
}

Assistant:

EbmlElement * EbmlElement::FindNextID(IOCallback & DataStream, const EbmlCallbacks & ClassInfos, uint64 MaxDataSize)
{
  binary PossibleId[4];
  int PossibleID_Length = 0;
  binary PossibleSize[8]; // we don't support size stored in more than 64 bits
  uint32 PossibleSizeLength = 0;
  uint64 SizeUnknown = 0;
  uint64 SizeFound = 0;
  bool bElementFound = false;

  binary BitMask;
  uint64 aElementPosition = 0, aSizePosition = 0;
  while (!bElementFound) {
    // read ID
    aElementPosition = DataStream.getFilePointer();
    uint32 ReadSize = 0;
    BitMask = 1 << 7;
    while (1) {
      ReadSize += DataStream.read(&PossibleId[PossibleID_Length], 1);
      if (ReadSize == uint32(PossibleID_Length)) {
        return NULL; // no more data ?
      }
      if (++PossibleID_Length > 4) {
        return NULL; // we don't support element IDs over class D
      }
      if (PossibleId[0] & BitMask) {
        // this is the last octet of the ID
        // check wether that's the one we're looking for
/*      if (PossibleID == EBML_INFO_ID(ClassInfos)) {
          break;
        } else {
          /// \todo This element should be skipped (use a context ?)
        }*/
        bElementFound = true; /// \todo not exactly the one we're looking for
        break;
      }
      BitMask >>= 1;
    }

    // read the data size
    aSizePosition = DataStream.getFilePointer();
    uint32 _SizeLength;
    do {
      if (PossibleSizeLength >= 8)
        // Size is larger than 8 bytes
        return NULL;

      ReadSize += DataStream.read(&PossibleSize[PossibleSizeLength++], 1);
      _SizeLength = PossibleSizeLength;
      SizeFound = ReadCodedSizeValue(&PossibleSize[0], _SizeLength, SizeUnknown);
    } while (_SizeLength == 0);
  }

  EbmlElement *Result = NULL;
  EbmlId PossibleID(PossibleId, PossibleID_Length);
  if (PossibleID == EBML_INFO_ID(ClassInfos)) {
    // the element is the one expected
    Result = &EBML_INFO_CREATE(ClassInfos);
  } else {
    /// \todo find the element in the context
    Result = new (std::nothrow) EbmlDummy(PossibleID);
    if(Result == NULL)
      return NULL;
  }

  Result->SetSizeLength(PossibleSizeLength);

  Result->Size = SizeFound;

  if (!Result->ValidateSize() || (SizeFound != SizeUnknown && MaxDataSize < Result->Size)) {
    delete Result;
    return NULL;
  }

  // check if the size is not all 1s
  if (SizeFound == SizeUnknown) {
    // Size of this element is unknown
    // only possible for Master elements
    if (!Result->SetSizeInfinite()) {
      /// \todo the element is not allowed to be infinite
      delete Result;
      return NULL;
    }
  } else Result->SetSizeInfinite(false);
  Result->ElementPosition = aElementPosition;
  Result->SizePosition = aSizePosition;

  return Result;
}